

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_paged_audio_buffer_read_pcm_frames
                    (ma_paged_audio_buffer *pPagedAudioBuffer,void *pFramesOut,ma_uint64 frameCount,
                    ma_uint64 *pFramesRead)

{
  ma_format mVar1;
  ma_uint32 mVar2;
  ma_result mVar3;
  ma_paged_audio_buffer_page *pmVar4;
  ma_uint64 mVar5;
  ulong uVar6;
  ma_uint64 mVar7;
  undefined1 *__dest;
  ma_uint64 mVar8;
  ulong uVar9;
  
  if (pPagedAudioBuffer == (ma_paged_audio_buffer *)0x0) {
    mVar3 = MA_INVALID_ARGS;
  }
  else {
    mVar1 = pPagedAudioBuffer->pData->format;
    mVar2 = pPagedAudioBuffer->pData->channels;
    mVar7 = 0;
    while (uVar6 = frameCount - mVar7, mVar7 <= frameCount && uVar6 != 0) {
      pmVar4 = pPagedAudioBuffer->pCurrent;
      mVar5 = pPagedAudioBuffer->relativeCursor;
      mVar8 = pmVar4->sizeInFrames;
      uVar9 = mVar8 - mVar5;
      if (uVar6 <= mVar8 - mVar5) {
        uVar9 = uVar6;
      }
      uVar6 = (ulong)(*(int *)(&DAT_00176420 + (ulong)mVar1 * 4) * mVar2);
      __dest = (undefined1 *)(mVar7 * uVar6 + (long)pFramesOut);
      if (__dest != pmVar4->pAudioData + mVar5 * uVar6) {
        memcpy(__dest,pmVar4->pAudioData + mVar5 * uVar6,uVar6 * uVar9);
        pmVar4 = pPagedAudioBuffer->pCurrent;
        mVar5 = pPagedAudioBuffer->relativeCursor;
        mVar8 = pmVar4->sizeInFrames;
      }
      pPagedAudioBuffer->absoluteCursor = pPagedAudioBuffer->absoluteCursor + uVar9;
      mVar7 = mVar7 + uVar9;
      pPagedAudioBuffer->relativeCursor = mVar5 + uVar9;
      if (mVar5 + uVar9 == mVar8) {
        if (pmVar4->pNext == (ma_paged_audio_buffer_page *)0x0) {
          mVar3 = MA_AT_END;
          goto LAB_0014859f;
        }
        pPagedAudioBuffer->pCurrent = pmVar4->pNext;
        pPagedAudioBuffer->relativeCursor = 0;
      }
    }
    mVar3 = MA_SUCCESS;
LAB_0014859f:
    if (pFramesRead != (ma_uint64 *)0x0) {
      *pFramesRead = mVar7;
    }
  }
  return mVar3;
}

Assistant:

MA_API ma_result ma_paged_audio_buffer_read_pcm_frames(ma_paged_audio_buffer* pPagedAudioBuffer, void* pFramesOut, ma_uint64 frameCount, ma_uint64* pFramesRead)
{
    ma_result result = MA_SUCCESS;
    ma_uint64 totalFramesRead = 0;
    ma_format format;
    ma_uint32 channels;

    if (pPagedAudioBuffer == NULL) {
        return MA_INVALID_ARGS;
    }

    format   = pPagedAudioBuffer->pData->format;
    channels = pPagedAudioBuffer->pData->channels;

    while (totalFramesRead < frameCount) {
        /* Read from the current page. The buffer should never be in a state where this is NULL. */
        ma_uint64 framesRemainingInCurrentPage;
        ma_uint64 framesRemainingToRead = frameCount - totalFramesRead;
        ma_uint64 framesToReadThisIteration;

        MA_ASSERT(pPagedAudioBuffer->pCurrent != NULL);

        framesRemainingInCurrentPage = pPagedAudioBuffer->pCurrent->sizeInFrames - pPagedAudioBuffer->relativeCursor;

        framesToReadThisIteration = ma_min(framesRemainingInCurrentPage, framesRemainingToRead);
        ma_copy_pcm_frames(ma_offset_pcm_frames_ptr(pFramesOut, totalFramesRead, format, channels), ma_offset_pcm_frames_ptr(pPagedAudioBuffer->pCurrent->pAudioData, pPagedAudioBuffer->relativeCursor, format, channels), framesToReadThisIteration, format, channels);
        totalFramesRead += framesToReadThisIteration;

        pPagedAudioBuffer->absoluteCursor += framesToReadThisIteration;
        pPagedAudioBuffer->relativeCursor += framesToReadThisIteration;

        /* Move to the next page if necessary. If there's no more pages, we need to return MA_AT_END. */
        MA_ASSERT(pPagedAudioBuffer->relativeCursor <= pPagedAudioBuffer->pCurrent->sizeInFrames);

        if (pPagedAudioBuffer->relativeCursor == pPagedAudioBuffer->pCurrent->sizeInFrames) {
            /* We reached the end of the page. Need to move to the next. If there's no more pages, we're done. */
            ma_paged_audio_buffer_page* pNext = (ma_paged_audio_buffer_page*)ma_atomic_load_ptr(&pPagedAudioBuffer->pCurrent->pNext);
            if (pNext == NULL) {
                result = MA_AT_END;
                break;  /* We've reached the end. */
            } else {
                pPagedAudioBuffer->pCurrent       = pNext;
                pPagedAudioBuffer->relativeCursor = 0;
            }
        }
    }

    if (pFramesRead != NULL) {
        *pFramesRead = totalFramesRead;
    }

    return result;
}